

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api_test.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s1;
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  size_t sVar7;
  bool bVar8;
  long lVar9;
  long lVar10;
  VpuApiDemoCmdContext_t demoCmdCtx;
  VpuApiDemoCmdContext_t local_1e0;
  
  puts("/*******  vpu api demo in *******/");
  if (argc == 1) {
    show_usage();
    return 0;
  }
  vpuapi_hdl = (void *)dlopen("libvpu.so",0x101);
  if (vpuapi_hdl == (void *)0x0) {
    puts("failed to open libvpu.so");
  }
  else {
    vpuapi_open_ctx = (_func_RK_S32_VpuCodecContext_t_ptr_ptr *)dlsym(vpuapi_hdl,"vpu_open_context")
    ;
    vpuapi_close_ctx =
         (_func_RK_S32_VpuCodecContext_t_ptr_ptr *)dlsym(vpuapi_hdl,"vpu_close_context");
    vpuapi_mem_link = (_func_RK_S32_VPUMemLinear_t_ptr *)dlsym(vpuapi_hdl,"VPUMemLink");
    vpuapi_mem_free = (_func_RK_S32_VPUMemLinear_t_ptr *)dlsym(vpuapi_hdl,"VPUFreeLinear");
    if ((vpuapi_mem_free != (_func_RK_S32_VPUMemLinear_t_ptr *)0x0 &&
        vpuapi_mem_link != (_func_RK_S32_VPUMemLinear_t_ptr *)0x0) &&
        (vpuapi_close_ctx != (_func_RK_S32_VpuCodecContext_t_ptr_ptr *)0x0 &&
        vpuapi_open_ctx != (_func_RK_S32_VpuCodecContext_t_ptr_ptr *)0x0)) {
      printf("get vpuapi handle %p vpu_open_context %p vpu_close_context %p\n");
      memset(&local_1e0,0,0x1b0);
      local_1e0.codec_type = CODEC_DECODER;
      if (1 < argc) {
        lVar9 = 1;
        bVar8 = false;
LAB_00101442:
        lVar10 = (long)(int)lVar9;
        do {
          lVar9 = lVar10 + 1;
          if (((!bVar8) && (pcVar6 = argv[lVar10], *pcVar6 == '-')) && (pcVar6[1] != '\0')) {
            if (pcVar6[1] == '-') {
              if (pcVar6[2] == '\0') goto LAB_00101674;
              pcVar6 = pcVar6 + 1;
            }
            __s1 = pcVar6 + 1;
            bVar1 = pcVar6[1];
            if (bVar1 < 0x6f) {
              if (bVar1 == 0x68) {
                if ((pcVar6[2] != '\0') && (iVar3 = strncmp(__s1,"help",4), iVar3 == 0)) {
                  show_help();
                  iVar3 = 1;
                  bVar2 = false;
                  goto LAB_00101684;
                }
                if (argv[lVar9] == (char *)0x0) {
                  pcVar6 = "input height is invalid";
                  goto LAB_00101737;
                }
                local_1e0.height = atoi(argv[lVar9]);
              }
              else if (bVar1 == 0x69) {
                pcVar6 = argv[lVar9];
                if (pcVar6 == (char *)0x0) {
                  pcVar6 = "input file is invalid";
                  goto LAB_00101737;
                }
                sVar7 = strlen(pcVar6);
                memcpy(local_1e0.input_file,pcVar6,sVar7);
                sVar7 = strlen(pcVar6);
                local_1e0.input_file[sVar7] = '\0';
                local_1e0.have_input = '\x01';
              }
              else {
LAB_001015ab:
                iVar3 = -1;
                bVar2 = true;
                if ((pcVar6[2] == '\0') || (pcVar6 = argv[lVar9], pcVar6 == (char *)0x0))
                goto LAB_00101684;
                iVar3 = strncmp(__s1,"coding",6);
                if (iVar3 == 0) {
                  printf("coding, argv[optindex]: %s",pcVar6);
                  local_1e0.coding = atoi(argv[lVar9]);
                }
                else {
                  iVar3 = strncmp(__s1,"vframes",7);
                  if (iVar3 == 0) {
                    local_1e0.record_frames = atoi(pcVar6);
                  }
                  else {
                    iVar4 = strncmp(__s1,"ss",2);
                    iVar3 = -1;
                    bVar2 = true;
                    if (iVar4 != 0) goto LAB_00101684;
                    iVar3 = atoi(pcVar6);
                    local_1e0.record_start_ms = (RK_S64)iVar3;
                  }
                }
              }
            }
            else if (bVar1 == 0x6f) {
              pcVar6 = argv[lVar9];
              if (pcVar6 == (char *)0x0) {
                pcVar6 = "out file is invalid";
LAB_00101737:
                puts(pcVar6);
                iVar3 = -1;
                bVar2 = true;
                goto LAB_00101684;
              }
              sVar7 = strlen(pcVar6);
              memcpy(local_1e0.output_file,pcVar6,sVar7);
              sVar7 = strlen(pcVar6);
              local_1e0.output_file[sVar7] = '\0';
              local_1e0.have_output = '\x01';
            }
            else if (bVar1 == 0x74) {
              if (argv[lVar9] == (char *)0x0) {
                pcVar6 = "input codec_type is invalid";
                goto LAB_00101737;
              }
              local_1e0.codec_type = atoi(argv[lVar9]);
            }
            else {
              if (bVar1 != 0x77) goto LAB_001015ab;
              if (argv[lVar9] == (char *)0x0) {
                pcVar6 = "input width is invalid";
                goto LAB_00101737;
              }
              local_1e0.width = atoi(argv[lVar9]);
            }
          }
          lVar10 = lVar9;
          if ((long)(ulong)(uint)argc <= lVar9) goto LAB_00101680;
        } while( true );
      }
      goto LAB_00101688;
    }
    printf("failed to open vpu_open_context %p vpu_close_context %p\n",vpuapi_open_ctx,
           vpuapi_close_ctx);
    printf("failed to open VPUMemLink %p VPUFreeLinear %p\n",vpuapi_mem_link,vpuapi_mem_free);
  }
  uVar5 = 0xffffffff;
  goto LAB_001013b2;
LAB_00101674:
  bVar8 = true;
  if (argc <= (int)lVar9) goto LAB_00101680;
  goto LAB_00101442;
LAB_00101680:
  bVar2 = false;
  iVar3 = 0;
LAB_00101684:
  if (bVar2) {
LAB_00101688:
    puts("vpu api demo, input parameter invalid");
    show_usage();
    iVar3 = -0x65;
  }
  if (iVar3 == 0) {
    if (local_1e0.codec_type == CODEC_ENCODER) {
      uVar5 = vpu_encode_demo(&local_1e0);
    }
    else {
      uVar5 = 0xffffff9b;
      if (local_1e0.codec_type == CODEC_DECODER) {
        uVar5 = vpu_decode_demo(&local_1e0);
      }
    }
  }
  else {
    if (iVar3 == 1) {
      return 0;
    }
    puts("parse_options fail\n");
    show_usage();
    uVar5 = 0xffffff9b;
  }
LAB_001013b2:
  if (uVar5 == 0) {
    puts("vpu api demo complete OK.");
  }
  else {
    printf("vpu api demo fail, err: %d\n",(ulong)uVar5);
    if (vpuapi_hdl != (void *)0x0) {
      dlclose();
      vpuapi_hdl = (void *)0x0;
    }
  }
  return uVar5;
}

Assistant:

int main(int argc, char **argv)
{
    RK_S32 ret = 0;
    VpuApiDemoCmdContext_t demoCmdCtx;
    VpuApiDemoCmdContext_t *cmd = NULL;

    printf("/*******  vpu api demo in *******/\n");
    if (argc == 1) {
        show_usage();
        return 0;
    }

    /* open library for access */
    vpuapi_hdl = dlopen("libvpu.so", RTLD_LAZY | RTLD_GLOBAL);
    if (NULL == vpuapi_hdl) {
        printf("failed to open libvpu.so\n");
        ret = -1;
        goto DEMO_OUT;
    }

    vpuapi_open_ctx = (RK_S32 (*)(VpuCodecContext_t **ctx))dlsym(vpuapi_hdl, "vpu_open_context");
    vpuapi_close_ctx = (RK_S32 (*)(VpuCodecContext_t **ctx))dlsym(vpuapi_hdl, "vpu_close_context");
    vpuapi_mem_link = (RK_S32 (*)(VPUMemLinear_t * p))dlsym(vpuapi_hdl, "VPUMemLink");
    vpuapi_mem_free = (RK_S32 (*)(VPUMemLinear_t * p))dlsym(vpuapi_hdl, "VPUFreeLinear");

    if (NULL == vpuapi_open_ctx || NULL == vpuapi_close_ctx ||
        NULL == vpuapi_mem_link || NULL == vpuapi_mem_free) {
        printf("failed to open vpu_open_context %p vpu_close_context %p\n",
               vpuapi_open_ctx, vpuapi_close_ctx);
        printf("failed to open VPUMemLink %p VPUFreeLinear %p\n",
               vpuapi_mem_link, vpuapi_mem_free);
        ret = -1;
        goto DEMO_OUT;
    }

    printf("get vpuapi handle %p vpu_open_context %p vpu_close_context %p\n",
           vpuapi_hdl, vpuapi_open_ctx, vpuapi_close_ctx);

    cmd = &demoCmdCtx;
    memset(cmd, 0, sizeof(VpuApiDemoCmdContext_t));
    cmd->codec_type = CODEC_DECODER;
    if ((ret = parse_options(argc, argv, cmd)) != 0) {
        if (ret == VPU_DEMO_PARSE_HELP_OK) {
            return 0;
        }

        printf("parse_options fail\n\n");
        show_usage();
        DEMO_ERR_RET(ERROR_INVALID_PARAM);
    }

    switch (cmd->codec_type) {
    case CODEC_DECODER : {
        ret = vpu_decode_demo(cmd);
    } break;
    case CODEC_ENCODER : {
        ret = vpu_encode_demo(cmd);
    } break;
    default : {
        ret = ERROR_INVALID_PARAM;
    } break;
    }

DEMO_OUT:
    if (ret) {
        printf("vpu api demo fail, err: %d\n", ret);
        if (vpuapi_hdl) {
            dlclose(vpuapi_hdl);
            vpuapi_hdl = NULL;
        }
    } else {
        printf("vpu api demo complete OK.\n");
    }
    return ret;
}